

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_14803::TestCheckCloseTrue::RunImpl(TestCheckCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestResults results;
  float local_6c;
  float local_68;
  float local_64;
  TestDetails local_60;
  TestResults local_40;
  
  UnitTest::TestResults::TestResults(&local_40,(TestReporter *)0x0);
  local_68 = 3.001;
  local_6c = 3.0;
  local_64 = 0.1;
  UnitTest::TestDetails::TestDetails(&local_60,"","","",0);
  UnitTest::CheckClose<float,float,float>(&local_40,&local_68,&local_6c,&local_64,&local_60);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68 = 0.0;
  local_6c = (float)UnitTest::TestResults::GetFailureCount(&local_40);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0x67);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_68,(int *)&local_6c,&local_60);
  return;
}

Assistant:

TEST(CheckCloseTrue)
{
    TestResults results;
    CheckClose(results, 3.001f, 3.0f, 0.1f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}